

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int randomx_blake2b_init_key(blake2b_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  ulong in_RCX;
  void *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint8_t block [128];
  blake2b_param P;
  undefined1 auStack_e8 [8];
  blake2b_param *in_stack_ffffffffffffff20;
  blake2b_state *in_stack_ffffffffffffff28;
  void *in_stack_ffffffffffffff30;
  blake2b_state *in_stack_ffffffffffffff38;
  undefined1 auStack_56 [14];
  undefined1 auStack_48 [16];
  undefined1 auStack_38 [16];
  ulong local_28;
  void *local_20;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else if ((in_RSI == 0) || (0x40 < in_RSI)) {
    blake2b_invalidate_state((blake2b_state *)0x128095);
    local_4 = -1;
  }
  else if ((in_RDX == (void *)0x0) || ((in_RCX == 0 || (0x40 < in_RCX)))) {
    blake2b_invalidate_state((blake2b_state *)0x1280d3);
    local_4 = -1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    memset(auStack_56,0,0xe);
    memset(auStack_48,0,0x10);
    memset(auStack_38,0,0x10);
    iVar1 = randomx_blake2b_init_param(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if (iVar1 < 0) {
      blake2b_invalidate_state((blake2b_state *)0x1281a7);
      local_4 = -1;
    }
    else {
      memset(auStack_e8,0,0x80);
      memcpy(auStack_e8,local_20,local_28);
      randomx_blake2b_update
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 (size_t)in_stack_ffffffffffffff28);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int blake2b_init_key(blake2b_state *S, size_t outlen, const void *key, size_t keylen) {
	blake2b_param P;

	if (S == NULL) {
		return -1;
	}

	if ((outlen == 0) || (outlen > BLAKE2B_OUTBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	if ((key == 0) || (keylen == 0) || (keylen > BLAKE2B_KEYBYTES)) {
		blake2b_invalidate_state(S);
		return -1;
	}

	/* Setup Parameter Block for keyed BLAKE2 */
	P.digest_length = (uint8_t)outlen;
	P.key_length = (uint8_t)keylen;
	P.fanout = 1;
	P.depth = 1;
	P.leaf_length = 0;
	P.node_offset = 0;
	P.node_depth = 0;
	P.inner_length = 0;
	memset(P.reserved, 0, sizeof(P.reserved));
	memset(P.salt, 0, sizeof(P.salt));
	memset(P.personal, 0, sizeof(P.personal));

	if (blake2b_init_param(S, &P) < 0) {
		blake2b_invalidate_state(S);
		return -1;
	}

	{
		uint8_t block[BLAKE2B_BLOCKBYTES];
		memset(block, 0, BLAKE2B_BLOCKBYTES);
		memcpy(block, key, keylen);
		blake2b_update(S, block, BLAKE2B_BLOCKBYTES);
		/* Burn the key from stack */
		//clear_internal_memory(block, BLAKE2B_BLOCKBYTES);
	}
	return 0;
}